

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O2

void h2o__hostinfo_getaddr_dispatch(h2o_hostinfo_getaddr_req_t *req)

{
  st_h2o_linklist_t *psVar1;
  FILE *__stream;
  int __errnum;
  char *pcVar2;
  pthread_t tid;
  pthread_attr_t local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&queue);
  psVar1 = queue.pending.prev;
  if ((req->_pending).next != (st_h2o_linklist_t *)0x0) {
    __assert_fail("!h2o_linklist_is_linked(node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/linklist.h"
                  ,0x59,"void h2o_linklist_insert(h2o_linklist_t *, h2o_linklist_t *)");
  }
  (req->_pending).prev = queue.pending.prev;
  (req->_pending).next = (st_h2o_linklist_t *)0x24fda0;
  psVar1->next = &req->_pending;
  ((req->_pending).next)->prev = &req->_pending;
  if ((queue.num_threads_idle == 0) && (queue.num_threads < h2o_hostinfo_max_threads)) {
    pthread_attr_init(&local_40);
    pthread_attr_setdetachstate(&local_40,1);
    pthread_attr_setstacksize(&local_40,0x19000);
    __errnum = pthread_create(&tid,(pthread_attr_t *)0x0,lookup_thread_main,(void *)0x0);
    __stream = _stderr;
    if (__errnum == 0) {
      queue.num_threads = queue.num_threads + 1;
      queue.num_threads_idle = queue.num_threads_idle + 1;
    }
    else {
      if (queue.num_threads == 0) {
        pcVar2 = strerror(__errnum);
        fprintf(__stream,"failed to start first thread for getaddrinfo:%s\n",pcVar2);
        abort();
      }
      perror("pthread_create(for getaddrinfo)");
    }
  }
  pthread_cond_signal((pthread_cond_t *)&queue.cond);
  pthread_mutex_unlock((pthread_mutex_t *)&queue);
  return;
}

Assistant:

void h2o__hostinfo_getaddr_dispatch(h2o_hostinfo_getaddr_req_t *req)
{
    pthread_mutex_lock(&queue.mutex);

    h2o_linklist_insert(&queue.pending, &req->_pending);

    if (queue.num_threads_idle == 0 && queue.num_threads < h2o_hostinfo_max_threads)
        create_lookup_thread();

    pthread_cond_signal(&queue.cond);
    pthread_mutex_unlock(&queue.mutex);
}